

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.c
# Opt level: O3

size_t HIST_count_parallel_wksp
                 (uint *count,uint *maxSymbolValuePtr,void *source,size_t sourceSize,
                 HIST_checkInput_e check,U32 *workSpace)

{
  byte *pbVar1;
  U32 *pUVar2;
  int *piVar3;
  U32 *pUVar4;
  U32 *pUVar5;
  U32 *pUVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  byte *pbVar10;
  byte *pbVar11;
  size_t sVar12;
  size_t __n;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  
  __n = (ulong)(*maxSymbolValuePtr + 1) << 2;
  if (sourceSize == 0) {
    sVar12 = 0;
    memset(count,0,__n);
    *maxSymbolValuePtr = 0;
  }
  else {
    pbVar1 = (byte *)((long)source + sourceSize);
    memset(workSpace,0,0x1000);
    if (0x13 < (long)sourceSize) {
      uVar14 = *source;
      pbVar10 = (byte *)source;
      do {
        uVar19 = *(uint *)(pbVar10 + 4);
        workSpace[uVar14 & 0xff] = workSpace[uVar14 & 0xff] + 1;
        workSpace[(ulong)(uVar14 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar14 >> 8 & 0xff) + 0x100] + 1;
        piVar3 = (int *)((long)workSpace + (ulong)(uVar14 >> 0xe & 0x3fc) + 0x800);
        *piVar3 = *piVar3 + 1;
        workSpace[(ulong)(uVar14 >> 0x18) + 0x300] = workSpace[(ulong)(uVar14 >> 0x18) + 0x300] + 1;
        uVar14 = *(uint *)(pbVar10 + 8);
        workSpace[uVar19 & 0xff] = workSpace[uVar19 & 0xff] + 1;
        workSpace[(ulong)(uVar19 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar19 >> 8 & 0xff) + 0x100] + 1;
        piVar3 = (int *)((long)workSpace + (ulong)(uVar19 >> 0xe & 0x3fc) + 0x800);
        *piVar3 = *piVar3 + 1;
        workSpace[(ulong)(uVar19 >> 0x18) + 0x300] = workSpace[(ulong)(uVar19 >> 0x18) + 0x300] + 1;
        uVar19 = *(uint *)(pbVar10 + 0xc);
        workSpace[uVar14 & 0xff] = workSpace[uVar14 & 0xff] + 1;
        workSpace[(ulong)(uVar14 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar14 >> 8 & 0xff) + 0x100] + 1;
        piVar3 = (int *)((long)workSpace + (ulong)(uVar14 >> 0xe & 0x3fc) + 0x800);
        *piVar3 = *piVar3 + 1;
        workSpace[(ulong)(uVar14 >> 0x18) + 0x300] = workSpace[(ulong)(uVar14 >> 0x18) + 0x300] + 1;
        uVar14 = *(uint *)(pbVar10 + 0x10);
        workSpace[uVar19 & 0xff] = workSpace[uVar19 & 0xff] + 1;
        workSpace[(ulong)(uVar19 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar19 >> 8 & 0xff) + 0x100] + 1;
        piVar3 = (int *)((long)workSpace + (ulong)(uVar19 >> 0xe & 0x3fc) + 0x800);
        *piVar3 = *piVar3 + 1;
        workSpace[(ulong)(uVar19 >> 0x18) + 0x300] = workSpace[(ulong)(uVar19 >> 0x18) + 0x300] + 1;
        source = pbVar10 + 0x10;
        pbVar11 = pbVar10 + 0x14;
        pbVar10 = (byte *)source;
      } while (pbVar11 < pbVar1 + -0xf);
    }
    for (; source < pbVar1; source = (void *)((long)source + 1)) {
      workSpace[*source] = workSpace[*source] + 1;
    }
    uVar14 = 0;
    uVar19 = 0;
    uVar18 = 0;
    uVar7 = 0;
    lVar8 = 0;
    do {
      pUVar4 = workSpace + lVar8 + 0x100;
      pUVar5 = workSpace + lVar8 + 0x200;
      pUVar6 = workSpace + lVar8 + 0x300;
      pUVar2 = workSpace + lVar8;
      uVar20 = *pUVar2 + *pUVar6 + *pUVar5 + *pUVar4;
      uVar21 = pUVar2[1] + pUVar6[1] + pUVar5[1] + pUVar4[1];
      uVar22 = pUVar2[2] + pUVar6[2] + pUVar5[2] + pUVar4[2];
      uVar23 = pUVar2[3] + pUVar6[3] + pUVar5[3] + pUVar4[3];
      pUVar2 = workSpace + lVar8;
      *pUVar2 = uVar20;
      pUVar2[1] = uVar21;
      pUVar2[2] = uVar22;
      pUVar2[3] = uVar23;
      uVar13 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar20 ^ 0x80000000));
      uVar15 = -(uint)((int)(uVar19 ^ 0x80000000) < (int)(uVar21 ^ 0x80000000));
      uVar16 = -(uint)((int)(uVar18 ^ 0x80000000) < (int)(uVar22 ^ 0x80000000));
      uVar17 = -(uint)((int)(uVar7 ^ 0x80000000) < (int)(uVar23 ^ 0x80000000));
      uVar14 = ~uVar13 & uVar14 | uVar20 & uVar13;
      uVar19 = ~uVar15 & uVar19 | uVar21 & uVar15;
      uVar18 = ~uVar16 & uVar18 | uVar22 & uVar16;
      uVar7 = ~uVar17 & uVar7 | uVar23 & uVar17;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x100);
    uVar13 = -(uint)((int)(uVar18 ^ 0x80000000) < (int)(uVar14 ^ 0x80000000));
    uVar15 = -(uint)((int)(uVar7 ^ 0x80000000) < (int)(uVar19 ^ 0x80000000));
    uVar18 = ~uVar13 & uVar18 | uVar14 & uVar13;
    uVar19 = ~uVar15 & uVar7 | uVar19 & uVar15;
    uVar14 = -(uint)((int)(uVar19 ^ 0x80000000) < (int)(uVar18 ^ 0x80000000));
    uVar9 = 0x100;
    do {
      uVar7 = (int)uVar9 - 1;
      uVar9 = (ulong)uVar7;
    } while (workSpace[uVar9] == 0);
    if ((check == trustInput) || (sVar12 = 0xffffffffffffffd0, uVar7 <= *maxSymbolValuePtr)) {
      *maxSymbolValuePtr = uVar7;
      memmove(count,workSpace,__n);
      sVar12 = (size_t)(~uVar14 & uVar19 | uVar18 & uVar14);
    }
  }
  return sVar12;
}

Assistant:

static size_t HIST_count_parallel_wksp(
                                unsigned* count, unsigned* maxSymbolValuePtr,
                                const void* source, size_t sourceSize,
                                HIST_checkInput_e check,
                                U32* const workSpace)
{
    const BYTE* ip = (const BYTE*)source;
    const BYTE* const iend = ip+sourceSize;
    size_t const countSize = (*maxSymbolValuePtr + 1) * sizeof(*count);
    unsigned max=0;
    U32* const Counting1 = workSpace;
    U32* const Counting2 = Counting1 + 256;
    U32* const Counting3 = Counting2 + 256;
    U32* const Counting4 = Counting3 + 256;

    /* safety checks */
    assert(*maxSymbolValuePtr <= 255);
    if (!sourceSize) {
        ZSTD_memset(count, 0, countSize);
        *maxSymbolValuePtr = 0;
        return 0;
    }
    ZSTD_memset(workSpace, 0, 4*256*sizeof(unsigned));

    /* by stripes of 16 bytes */
    {   U32 cached = MEM_read32(ip); ip += 4;
        while (ip < iend-15) {
            U32 c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
        }
        ip-=4;
    }

    /* finish last symbols */
    while (ip<iend) Counting1[*ip++]++;

    {   U32 s;
        for (s=0; s<256; s++) {
            Counting1[s] += Counting2[s] + Counting3[s] + Counting4[s];
            if (Counting1[s] > max) max = Counting1[s];
    }   }

    {   unsigned maxSymbolValue = 255;
        while (!Counting1[maxSymbolValue]) maxSymbolValue--;
        if (check && maxSymbolValue > *maxSymbolValuePtr) return ERROR(maxSymbolValue_tooSmall);
        *maxSymbolValuePtr = maxSymbolValue;
        ZSTD_memmove(count, Counting1, countSize);   /* in case count & Counting1 are overlapping */
    }
    return (size_t)max;
}